

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

void __thiscall
fmt::BufferedFile::BufferedFile(BufferedFile *this,CStringRef filename,CStringRef mode)

{
  FILE *pFVar1;
  int *piVar2;
  SystemError *this_00;
  CStringRef filename_local;
  
  filename_local.data_ = filename.data_;
  do {
    pFVar1 = fopen(filename.data_,mode.data_);
    this->file_ = (FILE *)pFVar1;
    if (pFVar1 != (FILE *)0x0) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  SystemError::SystemError<fmt::BasicCStringRef<char>>
            (this_00,*piVar2,(CStringRef)0x10ef26,&filename_local);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

fmt::BufferedFile::BufferedFile(
    fmt::CStringRef filename, fmt::CStringRef mode) {
  FMT_RETRY_VAL(file_, FMT_SYSTEM(fopen(filename.c_str(), mode.c_str())), 0);
  if (!file_)
    FMT_THROW(SystemError(errno, "cannot open file {}", filename));
}